

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

void secp256k1_context_preallocated_destroy(secp256k1_context *ctx)

{
  if (ctx == (secp256k1_context *)0x0) {
    return;
  }
  if ((ctx->ecmult_gen_ctx).built != 0) {
    (ctx->ecmult_gen_ctx).built = 0;
    (ctx->ecmult_gen_ctx).scalar_offset.d[0] = 0;
    (ctx->ecmult_gen_ctx).scalar_offset.d[1] = 0;
    (ctx->ecmult_gen_ctx).scalar_offset.d[2] = 0;
    (ctx->ecmult_gen_ctx).scalar_offset.d[3] = 0;
    secp256k1_ge_clear(&(ctx->ecmult_gen_ctx).ge_offset);
    secp256k1_fe_impl_clear(&(ctx->ecmult_gen_ctx).proj_blind);
    return;
  }
  (*(ctx->illegal_callback).fn)
            ("ctx == NULL || secp256k1_context_is_proper(ctx)",(ctx->illegal_callback).data);
  return;
}

Assistant:

void secp256k1_context_preallocated_destroy(secp256k1_context* ctx) {
    ARG_CHECK_VOID(ctx == NULL || secp256k1_context_is_proper(ctx));

    /* Defined as noop */
    if (ctx == NULL) {
        return;
    }

    secp256k1_ecmult_gen_context_clear(&ctx->ecmult_gen_ctx);
}